

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void duckdb::FSSTStorage::Select
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  optional_ptr<duckdb::FileBuffer,_true> *this;
  uint uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  idx_t iVar4;
  FSSTScanState *scan_state;
  VectorStringBuffer *str_buffer;
  long lVar5;
  ulong compressed_string_len;
  ulong uVar6;
  data_ptr_t compressed_string;
  idx_t start;
  data_ptr_t pdVar7;
  ulong uVar8;
  anon_union_16_2_67f50693_for_value aVar9;
  bp_delta_offsets_t offsets;
  bp_delta_offsets_t local_68;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  this = &(scan_state->super_StringScanState).handle.node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  pdVar2 = ((scan_state->super_StringScanState).handle.node.ptr)->buffer;
  iVar3 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  uVar1 = *(uint *)(((scan_state->super_StringScanState).handle.node.ptr)->buffer +
                   segment->offset + 4);
  str_buffer = StringVector::GetStringBuffer(result);
  StartScan(&local_68,scan_state,pdVar2 + iVar3 + 0x10,start,vector_count);
  iVar4 = local_68.unused_delta_decoded_values;
  if (sel_count != 0) {
    pdVar7 = result->data + 8;
    uVar8 = 0;
    do {
      uVar6 = uVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)sel->sel_vector[uVar8];
      }
      compressed_string_len =
           (ulong)(scan_state->bitunpack_buffer).
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                  [local_68.scan_offset + uVar6];
      lVar5 = (long)(int)(scan_state->delta_decode_buffer).
                         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t
                         .super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar4 + uVar6];
      compressed_string = pdVar2 + ((uVar1 + iVar3) - lVar5);
      if (lVar5 == 0) {
        compressed_string = (data_ptr_t)0x0;
      }
      if (compressed_string_len == 0) {
        uVar6 = 0;
        aVar9 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
      }
      else {
        if (scan_state->all_values_inlined == true) {
          aVar9.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               FSSTPrimitives::DecompressInlinedValue
                         (scan_state->duckdb_fsst_decoder_ptr,(char *)compressed_string,
                          compressed_string_len);
        }
        else {
          aVar9.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               FSSTPrimitives::DecompressValue
                         (scan_state->duckdb_fsst_decoder_ptr,str_buffer,(char *)compressed_string,
                          compressed_string_len);
        }
        uVar6 = aVar9._0_8_ & 0xffffffff00000000;
      }
      *(ulong *)(pdVar7 + -8) = aVar9.pointer.length | uVar6;
      *(char **)pdVar7 = aVar9.pointer.ptr;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 0x10;
    } while (sel_count != uVar8);
  }
  scan_state->last_known_index =
       (scan_state->delta_decode_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
       [local_68.unused_delta_decoded_values + vector_count + 0xffffffffffffffff];
  scan_state->last_known_row = vector_count + start + -1;
  return;
}

Assistant:

void FSSTStorage::Select(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
                         const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);

	auto &str_buffer = StringVector::GetStringBuffer(result);
	auto offsets = StartScan(scan_state, base_data, start, vector_count);
	auto result_data = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < sel_count; i++) {
		idx_t index = sel.get_index(i);
		result_data[i] = scan_state.DecompressString(dict, baseptr, offsets, index, str_buffer);
	}
	EndScan(scan_state, offsets, start, vector_count);
}